

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O1

int GetLatestDataNMEADevice(NMEADEVICE *pNMEADevice,NMEADATA *pNMEAData)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  __time_t _Var10;
  __syscall_slong_t *p_Var11;
  int iVar12;
  char cVar13;
  long lVar14;
  size_t __n;
  NMEADEVICE *pNVar15;
  double dVar16;
  char c2;
  char c1;
  NMEADEVICE *local_19c8;
  char *local_19c0;
  char *local_19b8;
  char c0;
  double *local_19a8;
  double *local_19a0;
  double *local_1998;
  double *local_1990;
  char *local_1988;
  char *local_1980;
  char *local_1978;
  double *local_1970;
  char *local_1968;
  char *local_1960;
  char *local_1958;
  char *local_1950;
  char *local_1948;
  char *local_1940;
  int *local_1938;
  char *local_1930;
  double *local_1928;
  double *local_1920;
  double f2;
  double f1;
  CHRONO chrono;
  double f0;
  char aisbuf [128];
  char recvbuf [4096];
  char savebuf [2048];
  
  c0 = '\0';
  c1 = '\0';
  c2 = '\0';
  f0 = 0.0;
  f1 = 0.0;
  pcVar4 = (char *)0x0;
  f2 = 0.0;
  iVar3 = clock_getres(4,(timespec *)&chrono.Frequency);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,(timespec *)&chrono), iVar3 == 0)) {
    chrono.Suspended = 0;
    chrono.Finish.tv_sec = 0;
    chrono.Finish.tv_nsec = 0;
    chrono.Duration.tv_sec = 0;
    chrono.Duration.tv_nsec = 0;
  }
  memset(recvbuf,0,0x1000);
  memset(savebuf,0,0x800);
  iVar3 = (pNMEADevice->RS232Port).DevType;
  cVar13 = '\x01';
  if (iVar3 - 1U < 4) {
    pcVar4 = (char *)recv((pNMEADevice->RS232Port).s,recvbuf,0x7ff,0);
    if (-1 < (int)pcVar4) {
      cVar13 = ((int)pcVar4 == 0) * '\x02';
    }
  }
  else if (iVar3 == 0) {
    pcVar4 = (char *)read(*(int *)&(pNMEADevice->RS232Port).hDev,recvbuf,0x7ff);
    cVar13 = '\x01';
    if (-1 < (int)pcVar4) {
      cVar13 = ((int)pcVar4 == 0) * '\x02';
    }
  }
  if (cVar13 != '\0') goto LAB_0016372a;
  iVar3 = (int)pcVar4;
  if ((pNMEADevice->bSaveRawData != 0) && ((FILE *)pNMEADevice->pfSaveFile != (FILE *)0x0)) {
    fwrite(recvbuf,(long)iVar3,1,(FILE *)pNMEADevice->pfSaveFile);
    fflush((FILE *)pNMEADevice->pfSaveFile);
  }
  local_19c8 = pNMEADevice;
  if (0x7fe < iVar3) {
    if (iVar3 == 0x7ff) {
      do {
        _Var10 = chrono.Duration.tv_sec;
        p_Var11 = &chrono.Duration.tv_nsec;
        if (chrono.Suspended == 0) {
          clock_gettime(4,(timespec *)aisbuf);
          aisbuf._0_8_ = (aisbuf._0_8_ + chrono.Duration.tv_sec +
                         (aisbuf._8_8_ + chrono.Duration.tv_nsec) / 1000000000) -
                         chrono.Start.tv_sec;
          aisbuf._8_8_ = (aisbuf._8_8_ + chrono.Duration.tv_nsec) % 1000000000 -
                         chrono.Start.tv_nsec;
          if ((long)aisbuf._8_8_ < 0) {
            aisbuf._0_8_ = aisbuf._0_8_ + (long)aisbuf._8_8_ / 1000000000 + -1;
            aisbuf._8_8_ = (long)aisbuf._8_8_ % 1000000000 + 1000000000;
          }
          _Var10 = aisbuf._0_8_;
          p_Var11 = (__syscall_slong_t *)(aisbuf + 8);
        }
        if (4.0 < (double)*p_Var11 / 1000000000.0 + (double)_Var10) goto LAB_001647d7;
        memcpy(savebuf,recvbuf,(ulong)pcVar4 & 0xffffffff);
        iVar3 = (local_19c8->RS232Port).DevType;
        cVar13 = '\x01';
        if (iVar3 - 1U < 4) {
          pcVar4 = (char *)recv((local_19c8->RS232Port).s,recvbuf,0x7ff,0);
          if (-1 < (int)pcVar4) {
            cVar13 = ((int)pcVar4 == 0) * '\x02';
          }
        }
        else if (iVar3 == 0) {
          pcVar4 = (char *)read(*(int *)&(local_19c8->RS232Port).hDev,recvbuf,0x7ff);
          cVar13 = ((int)pcVar4 == 0) * '\x02';
          if ((int)pcVar4 < 0) {
            cVar13 = '\x01';
          }
        }
        pNVar15 = local_19c8;
        if (cVar13 != '\0') goto LAB_0016372a;
        if ((local_19c8->bSaveRawData != 0) && ((FILE *)local_19c8->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,(long)(int)pcVar4,1,(FILE *)local_19c8->pfSaveFile);
          fflush((FILE *)pNVar15->pfSaveFile);
        }
      } while ((int)pcVar4 == 0x7ff);
    }
    __n = (size_t)(int)pcVar4;
    memmove(recvbuf + (0x7ff - __n),recvbuf,__n);
    memcpy(recvbuf,savebuf + __n,(long)(0x7ff - (int)pcVar4));
    iVar3 = 0x7ff;
  }
  pNVar15 = local_19c8;
  local_19b8 = (char *)CONCAT44(local_19b8._4_4_,iVar3);
  local_19c0 = pcVar4;
  if (local_19c8->bEnableGPGGA == 0) {
LAB_00163a6d:
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$GPGGA");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar5 = strchr(pcVar4 + 6,0xd);
      if (pcVar5 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163a6d;
    do {
      pcVar5 = pcVar4;
      pcVar4 = strstr(pcVar5 + 6,"$GPGGA");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar6 = strchr(pcVar4 + 6,0xd);
        if (pcVar6 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  if (pNVar15->bEnableGPRMC == 0) {
LAB_00163af1:
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$GPRMC");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar6 = strchr(pcVar4 + 6,0xd);
      if (pcVar6 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163af1;
    do {
      pcVar6 = pcVar4;
      pcVar4 = strstr(pcVar6 + 6,"$GPRMC");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar7 = strchr(pcVar4 + 6,0xd);
        if (pcVar7 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  if (pNVar15->bEnableGPGLL == 0) {
LAB_00163b76:
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$GPGLL");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar7 = strchr(pcVar4 + 6,0xd);
      if (pcVar7 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163b76;
    do {
      pcVar7 = pcVar4;
      pcVar4 = strstr(pcVar7 + 6,"$GPGLL");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar8 = strchr(pcVar4 + 6,0xd);
        if (pcVar8 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  if (local_19c8->bEnableGPVTG == 0) {
LAB_00163bff:
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$GPVTG");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar8 = strchr(pcVar4 + 6,0xd);
      if (pcVar8 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163bff;
    do {
      pcVar8 = pcVar4;
      pcVar4 = strstr(pcVar8 + 6,"$GPVTG");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar4 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  if (local_19c8->bEnableHCHDG == 0) {
LAB_00163c8d:
    local_1948 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$HCHDG");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar9 = strchr(pcVar4 + 6,0xd);
      if (pcVar9 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163c8d;
    do {
      local_1948 = pcVar4;
      pcVar4 = strstr(pcVar4 + 6,"$HCHDG");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar4 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  if (local_19c8->bEnableIIMWV == 0) {
LAB_00163d24:
    local_1950 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$IIMWV");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar9 = strchr(pcVar4 + 6,0xd);
      if (pcVar9 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163d24;
    do {
      local_1950 = pcVar4;
      pcVar4 = strstr(pcVar4 + 6,"$IIMWV");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar4 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  if (local_19c8->bEnableWIMWV == 0) {
LAB_00163dbb:
    local_1958 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$WIMWV");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar9 = strchr(pcVar4 + 6,0xd);
      if (pcVar9 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163dbb;
    do {
      local_1958 = pcVar4;
      pcVar4 = strstr(pcVar4 + 6,"$WIMWV");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar4 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  if (local_19c8->bEnableWIMWD == 0) {
LAB_00163e4f:
    local_1960 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$WIMWD");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar9 = strchr(pcVar4 + 6,0xd);
      if (pcVar9 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163e4f;
    do {
      local_1960 = pcVar4;
      pcVar4 = strstr(pcVar4 + 6,"$WIMWD");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar4 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  pNVar15 = local_19c8;
  local_1930 = pcVar8;
  if (local_19c8->bEnableWIMDA == 0) {
LAB_00163ee9:
    local_1968 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"$WIMDA");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar8 = strchr(pcVar4 + 6,0xd);
      if (pcVar8 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163ee9;
    do {
      local_1968 = pcVar4;
      pcVar4 = strstr(pcVar4 + 6,"$WIMDA");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar8 = strchr(pcVar4 + 6,0xd);
        if (pcVar8 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  local_1978 = pcVar7;
  if (pNVar15->bEnableAIVDM == 0) {
LAB_00163f79:
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar4 = strstr(recvbuf,"!AIVDM");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar7 = strchr(pcVar4 + 6,0xd);
      if (pcVar7 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
    }
    if (pcVar4 == (char *)0x0) goto LAB_00163f79;
    do {
      pcVar7 = pcVar4;
      pcVar4 = strstr(pcVar7 + 6,"!AIVDM");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar8 = strchr(pcVar4 + 6,0xd);
        if (pcVar8 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
    } while (pcVar4 != (char *)0x0);
  }
  iVar3 = (int)local_19b8;
LAB_00163f80:
  pcVar4 = local_1978;
  if ((((((((pNVar15->bEnableGPGGA == 0) || (pcVar5 != (char *)0x0)) &&
          ((pNVar15->bEnableGPRMC == 0 || (pcVar6 != (char *)0x0)))) &&
         ((pNVar15->bEnableGPGLL == 0 || (local_1978 != (char *)0x0)))) &&
        ((pNVar15->bEnableGPVTG == 0 || (local_1930 != (char *)0x0)))) &&
       ((((pNVar15->bEnableHCHDG == 0 || (local_1948 != (char *)0x0)) &&
         ((pNVar15->bEnableIIMWV == 0 || (local_1950 != (char *)0x0)))) &&
        ((pNVar15->bEnableWIMWV == 0 || (local_1958 != (char *)0x0)))))) &&
      ((pNVar15->bEnableWIMWD == 0 || (local_1960 != (char *)0x0)))) &&
     (((pNVar15->bEnableWIMDA == 0 || (local_1968 != (char *)0x0)) &&
      ((pNVar15->bEnableAIVDM == 0 || (pcVar7 != (char *)0x0)))))) {
    memset(pNMEAData,0,0x3d8);
    if (pNVar15->bEnableGPGGA != 0) {
      local_19b8 = pNMEAData->szlatdeg;
      local_19c0 = pNMEAData->szlongdeg;
      local_1970 = (double *)(pNMEAData->szlatdeg + 1);
      local_19a0 = &pNMEAData->latmin;
      pcVar8 = &pNMEAData->north;
      local_1980 = pNMEAData->szlongdeg + 1;
      local_1988 = pNMEAData->szlongdeg + 2;
      local_1990 = &pNMEAData->longmin;
      local_1998 = (double *)&pNMEAData->east;
      local_19a8 = (double *)&pNMEAData->GPS_quality_indicator;
      local_1938 = &pNMEAData->nbsat;
      local_1920 = &pNMEAData->hdop;
      local_1928 = &pNMEAData->Altitude;
      pNMEAData->szlongdeg[0] = '\0';
      pNMEAData->szlongdeg[1] = '\0';
      pNMEAData->szlongdeg[2] = '\0';
      pNMEAData->szlongdeg[3] = '\0';
      pNMEAData->szlatdeg[0] = '\0';
      pNMEAData->szlatdeg[1] = '\0';
      pNMEAData->szlatdeg[2] = '\0';
      pNMEAData->szlongdeg[0] = '\0';
      local_1940 = pcVar8;
      iVar3 = __isoc99_sscanf(pcVar5,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M",
                              pNMEAData);
      if ((((iVar3 == 0xf) ||
           (iVar3 = __isoc99_sscanf(pcVar5,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M",
                                    pNMEAData,local_19b8,local_1970,local_19a0,pcVar8,local_19c0,
                                    local_1980,local_1988,local_1990,local_1998,local_19a8,
                                    local_1938,local_1920,local_1928), iVar3 == 0xe)) ||
          (iVar3 = __isoc99_sscanf(pcVar5,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d",pNMEAData,
                                   local_19b8,local_1970,local_19a0,pcVar8,local_19c0,local_1980,
                                   local_1988,local_1990,local_1998,local_19a8), iVar3 == 0xb)) ||
         ((iVar3 = __isoc99_sscanf(pcVar5,"$GPGGA,%lf,,,,,%d",pNMEAData,local_19a8), iVar3 == 2 ||
          (iVar3 = __isoc99_sscanf(pcVar5,"$GPGGA,,,,,,%d",local_19a8), iVar3 == 1)))) {
        dVar16 = pNMEAData->utc;
        if (0.0 < dVar16) {
          iVar3 = (int)dVar16 / 10000;
          pNMEAData->hour = iVar3;
          iVar12 = iVar3 * -100 + (int)dVar16 / 100;
          pNMEAData->minute = iVar12;
          pNMEAData->second = (dVar16 - (double)(iVar3 * 10000)) - (double)(iVar12 * 100);
        }
        if ((*local_19b8 != '\0') && (*local_19c0 != '\0')) {
          iVar3 = atoi(local_19b8);
          pNMEAData->latdeg = iVar3;
          iVar12 = atoi(local_19c0);
          pNMEAData->longdeg = iVar12;
          dVar16 = pNMEAData->latmin / 60.0 + (double)iVar3;
          if (pNMEAData->north != 'N') {
            dVar16 = -dVar16;
          }
          pNMEAData->Latitude = dVar16;
          dVar16 = pNMEAData->longmin / 60.0 + (double)iVar12;
          if (pNMEAData->east != 'E') {
            dVar16 = -dVar16;
          }
          pNMEAData->Longitude = dVar16;
          pcVar4 = local_1978;
        }
        goto LAB_00164b2f;
      }
LAB_001653e5:
      pcVar4 = "Error reading data from a NMEADevice : Invalid data. ";
      goto LAB_00163731;
    }
LAB_00164b2f:
    if (local_19c8->bEnableGPRMC != 0) {
      local_19b8 = pNMEAData->szlatdeg;
      local_19c0 = pNMEAData->szlongdeg;
      local_19a0 = (double *)&pNMEAData->status;
      local_1938 = (int *)(pNMEAData->szlatdeg + 1);
      pdVar1 = &pNMEAData->latmin;
      local_1980 = &pNMEAData->north;
      local_1988 = pNMEAData->szlongdeg + 1;
      local_1990 = (double *)(pNMEAData->szlongdeg + 2);
      local_1998 = &pNMEAData->longmin;
      local_1940 = &pNMEAData->east;
      local_1970 = &pNMEAData->sog;
      local_1920 = &pNMEAData->cog;
      local_1928 = &pNMEAData->date;
      pNMEAData->szlongdeg[0] = '\0';
      pNMEAData->szlongdeg[1] = '\0';
      pNMEAData->szlongdeg[2] = '\0';
      pNMEAData->szlongdeg[3] = '\0';
      pNMEAData->szlatdeg[0] = '\0';
      pNMEAData->szlatdeg[1] = '\0';
      pNMEAData->szlatdeg[2] = '\0';
      pNMEAData->szlongdeg[0] = '\0';
      local_19a8 = pdVar1;
      iVar3 = __isoc99_sscanf(pcVar6,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c",
                              pNMEAData);
      if ((((iVar3 != 0x10) &&
           (iVar3 = __isoc99_sscanf(pcVar6,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf",
                                    pNMEAData,local_19a0,local_19b8,local_1938,pdVar1,local_1980,
                                    local_19c0,local_1988,local_1990,local_1998,local_1940,
                                    local_1970,local_1920,local_1928), iVar3 != 0xe)) &&
          (iVar3 = __isoc99_sscanf(pcVar6,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c",pNMEAData,
                                   local_19a0,local_19b8,local_1938,pdVar1,local_1980,local_19c0,
                                   local_1988,local_1990,local_1998,local_1940), iVar3 != 0xb)) &&
         ((iVar3 = __isoc99_sscanf(pcVar6,"$GPRMC,%lf,%c",pNMEAData,local_19a0), iVar3 != 2 &&
          (iVar3 = __isoc99_sscanf(pcVar6,"$GPRMC,,%c",local_19a0), iVar3 != 1))))
      goto LAB_001653e5;
      dVar16 = pNMEAData->utc;
      if (0.0 < dVar16) {
        iVar3 = (int)dVar16 / 10000;
        pNMEAData->hour = iVar3;
        iVar12 = iVar3 * -100 + (int)dVar16 / 100;
        pNMEAData->minute = iVar12;
        pNMEAData->second = (dVar16 - (double)(iVar3 * 10000)) - (double)(iVar12 * 100);
      }
      if ((*local_19b8 != '\0') && (*local_19c0 != '\0')) {
        iVar3 = atoi(local_19b8);
        pNMEAData->latdeg = iVar3;
        iVar12 = atoi(local_19c0);
        pNMEAData->longdeg = iVar12;
        dVar16 = pNMEAData->latmin / 60.0 + (double)iVar3;
        if (pNMEAData->north != 'N') {
          dVar16 = -dVar16;
        }
        pNMEAData->Latitude = dVar16;
        dVar16 = pNMEAData->longmin / 60.0 + (double)iVar12;
        if (pNMEAData->east != 'E') {
          dVar16 = -dVar16;
        }
        pNMEAData->Longitude = dVar16;
        pcVar4 = local_1978;
      }
      pNMEAData->SOG = pNMEAData->sog / 1.94;
      pNMEAData->COG = (pNMEAData->cog * 3.141592653589793) / 180.0;
      if (0.0 < pNMEAData->date) {
        iVar3 = (int)pNMEAData->date;
        pNMEAData->day = iVar3 / 10000;
        iVar12 = (iVar3 / 10000) * -100 + iVar3 / 100;
        pNMEAData->month = iVar12;
        pNMEAData->year = iVar3 % 10000 + iVar12 * -100 + 2000;
      }
    }
    if (local_19c8->bEnableGPGLL != 0) {
      local_19b8 = pNMEAData->szlatdeg;
      pcVar5 = pNMEAData->szlongdeg;
      local_19c0 = pNMEAData->szlongdeg + 1;
      local_1978 = &pNMEAData->status;
      pNMEAData->szlongdeg[0] = '\0';
      pNMEAData->szlongdeg[1] = '\0';
      pNMEAData->szlongdeg[2] = '\0';
      pNMEAData->szlongdeg[3] = '\0';
      pNMEAData->szlatdeg[0] = '\0';
      pNMEAData->szlatdeg[1] = '\0';
      pNMEAData->szlatdeg[2] = '\0';
      pNMEAData->szlongdeg[0] = '\0';
      iVar3 = __isoc99_sscanf(pcVar4,"$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c",local_19b8,
                              pNMEAData->szlatdeg + 1,&pNMEAData->latmin,&pNMEAData->north,pcVar5,
                              local_19c0,pNMEAData->szlongdeg + 2,&pNMEAData->longmin,
                              &pNMEAData->east,pNMEAData,local_1978);
      if (((iVar3 != 0xb) &&
          (iVar3 = __isoc99_sscanf(pcVar4,"$GPGLL,,,,,%lf,%c",pNMEAData,local_1978), iVar3 != 2)) &&
         (iVar3 = __isoc99_sscanf(pcVar4,"$GPGLL,,,,,,%c",local_1978), iVar3 != 1))
      goto LAB_001653e5;
      if ((*local_19b8 != '\0') && (*pcVar5 != '\0')) {
        iVar3 = atoi(local_19b8);
        pNMEAData->latdeg = iVar3;
        iVar12 = atoi(pcVar5);
        pNMEAData->longdeg = iVar12;
        dVar16 = pNMEAData->latmin / 60.0 + (double)iVar3;
        if (pNMEAData->north != 'N') {
          dVar16 = -dVar16;
        }
        pNMEAData->Latitude = dVar16;
        dVar16 = pNMEAData->longmin / 60.0 + (double)iVar12;
        if (pNMEAData->east != 'E') {
          dVar16 = -dVar16;
        }
        pNMEAData->Longitude = dVar16;
      }
      dVar16 = pNMEAData->utc;
      if (0.0 < dVar16) {
        iVar3 = (int)dVar16 / 10000;
        pNMEAData->hour = iVar3;
        iVar12 = iVar3 * -100 + (int)dVar16 / 100;
        pNMEAData->minute = iVar12;
        pNMEAData->second = (dVar16 - (double)(iVar3 * 10000)) - (double)(iVar12 * 100);
      }
    }
    pcVar4 = local_1930;
    if (local_19c8->bEnableGPVTG != 0) {
      pdVar1 = &pNMEAData->cog;
      pdVar2 = &pNMEAData->sog;
      iVar3 = __isoc99_sscanf(local_1930,"$GPVTG,%lf,T,%lf,M,%lf,N",pdVar1,&pNMEAData->mag_cog,
                              pdVar2);
      if (((iVar3 != 3) &&
          (iVar3 = __isoc99_sscanf(pcVar4,"$GPVTG,%lf,T,,M,%lf,N",pdVar1,pdVar2), iVar3 != 2)) &&
         ((iVar3 = __isoc99_sscanf(pcVar4,"$GPVTG,%lf,T,,,%lf,N",pdVar1,pdVar2), iVar3 != 2 &&
          ((((iVar3 = __isoc99_sscanf(pcVar4,"$GPVTG,nan,T,nan,M,%lf,N",pdVar2), iVar3 != 1 &&
             (iVar3 = __isoc99_sscanf(pcVar4,"$GPVTG,NAN,T,NAN,M,%lf,N",pdVar2), iVar3 != 1)) &&
            (iVar3 = __isoc99_sscanf(pcVar4,"$GPVTG,NaN,T,NaN,M,%lf,N",pdVar2), iVar3 != 1)) &&
           ((iVar3 = __isoc99_sscanf(pcVar4,"$GPVTG,nan,T,,,%lf,N",pdVar2), iVar3 != 1 &&
            (iVar3 = __isoc99_sscanf(pcVar4,"$GPVTG,NAN,T,,,%lf,N",pdVar2), iVar3 != 1)))))))) {
        __isoc99_sscanf(pcVar4,"$GPVTG,NaN,T,,,%lf,N",pdVar2);
      }
      pNMEAData->SOG = pNMEAData->sog / 1.94;
      pNMEAData->COG = (pNMEAData->cog * 3.141592653589793) / 180.0;
    }
    if (local_19c8->bEnableHCHDG != 0) {
      __isoc99_sscanf(local_1948,"$HCHDG,%lf,%lf,%c,%lf,%c",&pNMEAData->heading,
                      &pNMEAData->deviation,&pNMEAData->dev_east,&pNMEAData->variation,
                      &pNMEAData->var_east);
      pNMEAData->Heading = (pNMEAData->heading * 3.141592653589793) / 180.0;
    }
    if (local_19c8->bEnableIIMWV != 0) {
      pdVar1 = &pNMEAData->awindspeed;
      iVar3 = __isoc99_sscanf(local_1950,"$IIMWV,%lf,R,%lf,%c,A",&pNMEAData->awinddir,pdVar1,
                              &pNMEAData->cawindspeed);
      if (iVar3 != 3) goto LAB_001653e5;
      pNMEAData->ApparentWindDir = (pNMEAData->awinddir * 3.141592653589793) / 180.0;
      switch(pNMEAData->cawindspeed) {
      case 'K':
        dVar16 = *pdVar1 * 0.28;
        break;
      default:
        goto switchD_0016531e_caseD_4c;
      case 'M':
        dVar16 = *pdVar1;
        break;
      case 'N':
        dVar16 = *pdVar1 * 0.51;
        break;
      case 'S':
        dVar16 = *pdVar1 * 0.45;
      }
      pNMEAData->ApparentWindSpeed = dVar16;
    }
switchD_0016531e_caseD_4c:
    if (local_19c8->bEnableWIMWV != 0) {
      pdVar1 = &pNMEAData->awindspeed;
      iVar3 = __isoc99_sscanf(local_1958,"$WIMWV,%lf,R,%lf,%c,A",&pNMEAData->awinddir,pdVar1,
                              &pNMEAData->cawindspeed);
      if (iVar3 != 3) goto LAB_001653e5;
      pNMEAData->ApparentWindDir = (pNMEAData->awinddir * 3.141592653589793) / 180.0;
      switch(pNMEAData->cawindspeed) {
      case 'K':
        dVar16 = *pdVar1 * 0.28;
        break;
      default:
        goto switchD_001653d5_caseD_4c;
      case 'M':
        dVar16 = *pdVar1;
        break;
      case 'N':
        dVar16 = *pdVar1 * 0.51;
        break;
      case 'S':
        dVar16 = *pdVar1 * 0.45;
      }
      pNMEAData->ApparentWindSpeed = dVar16;
    }
switchD_001653d5_caseD_4c:
    if (local_19c8->bEnableWIMWD != 0) {
      __isoc99_sscanf(local_1960,"$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c",&pNMEAData->winddir,
                      &pNMEAData->cwinddir,&f1,&c1,&f2,&c2,&pNMEAData->windspeed,
                      &pNMEAData->cwindspeed);
      pNMEAData->WindDir = (pNMEAData->winddir * 3.141592653589793) / 180.0;
      pNMEAData->WindSpeed = pNMEAData->windspeed;
    }
    if (local_19c8->bEnableWIMDA != 0) {
      __isoc99_sscanf(local_1968,"$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c",&f0
                      ,&c0,&pNMEAData->pressure,&pNMEAData->cpressure,&pNMEAData->temperature,
                      &pNMEAData->ctemperature,&pNMEAData->winddir,&pNMEAData->cwinddir,&f1,&c1,&f2,
                      &c2,&pNMEAData->windspeed,&pNMEAData->cwindspeed);
      pNMEAData->WindDir = (pNMEAData->winddir * 3.141592653589793) / 180.0;
      pNMEAData->WindSpeed = pNMEAData->windspeed;
    }
    if (local_19c8->bEnableAIVDM == 0) goto LAB_0016567d;
    aisbuf[0x70] = '\0';
    aisbuf[0x71] = '\0';
    aisbuf[0x72] = '\0';
    aisbuf[0x73] = '\0';
    aisbuf[0x74] = '\0';
    aisbuf[0x75] = '\0';
    aisbuf[0x76] = '\0';
    aisbuf[0x77] = '\0';
    aisbuf[0x78] = '\0';
    aisbuf[0x79] = '\0';
    aisbuf[0x7a] = '\0';
    aisbuf[0x7b] = '\0';
    aisbuf[0x7c] = '\0';
    aisbuf[0x7d] = '\0';
    aisbuf[0x7e] = '\0';
    aisbuf[0x7f] = '\0';
    aisbuf[0x60] = '\0';
    aisbuf[0x61] = '\0';
    aisbuf[0x62] = '\0';
    aisbuf[99] = '\0';
    aisbuf[100] = '\0';
    aisbuf[0x65] = '\0';
    aisbuf[0x66] = '\0';
    aisbuf[0x67] = '\0';
    aisbuf[0x68] = '\0';
    aisbuf[0x69] = '\0';
    aisbuf[0x6a] = '\0';
    aisbuf[0x6b] = '\0';
    aisbuf[0x6c] = '\0';
    aisbuf[0x6d] = '\0';
    aisbuf[0x6e] = '\0';
    aisbuf[0x6f] = '\0';
    aisbuf[0x50] = '\0';
    aisbuf[0x51] = '\0';
    aisbuf[0x52] = '\0';
    aisbuf[0x53] = '\0';
    aisbuf[0x54] = '\0';
    aisbuf[0x55] = '\0';
    aisbuf[0x56] = '\0';
    aisbuf[0x57] = '\0';
    aisbuf[0x58] = '\0';
    aisbuf[0x59] = '\0';
    aisbuf[0x5a] = '\0';
    aisbuf[0x5b] = '\0';
    aisbuf[0x5c] = '\0';
    aisbuf[0x5d] = '\0';
    aisbuf[0x5e] = '\0';
    aisbuf[0x5f] = '\0';
    aisbuf[0x40] = '\0';
    aisbuf[0x41] = '\0';
    aisbuf[0x42] = '\0';
    aisbuf[0x43] = '\0';
    aisbuf[0x44] = '\0';
    aisbuf[0x45] = '\0';
    aisbuf[0x46] = '\0';
    aisbuf[0x47] = '\0';
    aisbuf[0x48] = '\0';
    aisbuf[0x49] = '\0';
    aisbuf[0x4a] = '\0';
    aisbuf[0x4b] = '\0';
    aisbuf[0x4c] = '\0';
    aisbuf[0x4d] = '\0';
    aisbuf[0x4e] = '\0';
    aisbuf[0x4f] = '\0';
    aisbuf[0x30] = '\0';
    aisbuf[0x31] = '\0';
    aisbuf[0x32] = '\0';
    aisbuf[0x33] = '\0';
    aisbuf[0x34] = '\0';
    aisbuf[0x35] = '\0';
    aisbuf[0x36] = '\0';
    aisbuf[0x37] = '\0';
    aisbuf[0x38] = '\0';
    aisbuf[0x39] = '\0';
    aisbuf[0x3a] = '\0';
    aisbuf[0x3b] = '\0';
    aisbuf[0x3c] = '\0';
    aisbuf[0x3d] = '\0';
    aisbuf[0x3e] = '\0';
    aisbuf[0x3f] = '\0';
    aisbuf[0x20] = '\0';
    aisbuf[0x21] = '\0';
    aisbuf[0x22] = '\0';
    aisbuf[0x23] = '\0';
    aisbuf[0x24] = '\0';
    aisbuf[0x25] = '\0';
    aisbuf[0x26] = '\0';
    aisbuf[0x27] = '\0';
    aisbuf[0x28] = '\0';
    aisbuf[0x29] = '\0';
    aisbuf[0x2a] = '\0';
    aisbuf[0x2b] = '\0';
    aisbuf[0x2c] = '\0';
    aisbuf[0x2d] = '\0';
    aisbuf[0x2e] = '\0';
    aisbuf[0x2f] = '\0';
    aisbuf[0x10] = '\0';
    aisbuf[0x11] = '\0';
    aisbuf[0x12] = '\0';
    aisbuf[0x13] = '\0';
    aisbuf[0x14] = '\0';
    aisbuf[0x15] = '\0';
    aisbuf[0x16] = '\0';
    aisbuf[0x17] = '\0';
    aisbuf[0x18] = '\0';
    aisbuf[0x19] = '\0';
    aisbuf[0x1a] = '\0';
    aisbuf[0x1b] = '\0';
    aisbuf[0x1c] = '\0';
    aisbuf[0x1d] = '\0';
    aisbuf[0x1e] = '\0';
    aisbuf[0x1f] = '\0';
    aisbuf[0] = '\0';
    aisbuf[1] = '\0';
    aisbuf[2] = '\0';
    aisbuf[3] = '\0';
    aisbuf[4] = '\0';
    aisbuf[5] = '\0';
    aisbuf[6] = '\0';
    aisbuf[7] = '\0';
    aisbuf[8] = '\0';
    aisbuf[9] = '\0';
    aisbuf[10] = '\0';
    aisbuf[0xb] = '\0';
    aisbuf[0xc] = '\0';
    aisbuf[0xd] = '\0';
    aisbuf[0xe] = '\0';
    aisbuf[0xf] = '\0';
    __isoc99_sscanf(pcVar7,"!AIVDM,%d,%d,,%c,%127s",&pNMEAData->nbsentences,
                    &pNMEAData->sentence_number,&pNMEAData->AIS_channel);
    if ((pNMEAData->nbsentences != 1) || (pNMEAData->sentence_number != 1)) goto LAB_0016567d;
    iVar3 = 0;
    lVar14 = 0;
    goto LAB_001655ff;
  }
  if (chrono.Suspended == 0) {
    clock_gettime(4,(timespec *)aisbuf);
    aisbuf._0_8_ = (aisbuf._0_8_ + chrono.Duration.tv_sec +
                   (aisbuf._8_8_ + chrono.Duration.tv_nsec) / 1000000000) - chrono.Start.tv_sec;
    aisbuf._8_8_ = (aisbuf._8_8_ + chrono.Duration.tv_nsec) % 1000000000 - chrono.Start.tv_nsec;
    if ((long)aisbuf._8_8_ < 0) {
      aisbuf._0_8_ = aisbuf._0_8_ + (long)aisbuf._8_8_ / 1000000000 + -1;
      aisbuf._8_8_ = (long)aisbuf._8_8_ % 1000000000 + 1000000000;
    }
    p_Var11 = (__syscall_slong_t *)(aisbuf + 8);
    _Var10 = aisbuf._0_8_;
  }
  else {
    p_Var11 = &chrono.Duration.tv_nsec;
    _Var10 = chrono.Duration.tv_sec;
  }
  if (4.0 < (double)*p_Var11 / 1000000000.0 + (double)_Var10) {
LAB_001647d7:
    puts("Error reading data from a NMEADevice : Message timeout. ");
    return 2;
  }
  if (0xffe < iVar3) {
    puts("Error reading data from a NMEADevice : Invalid data. ");
    return 4;
  }
  pcVar8 = recvbuf + iVar3;
  local_19b8 = (char *)CONCAT44(local_19b8._4_4_,iVar3);
  iVar12 = (pNVar15->RS232Port).DevType;
  cVar13 = '\x01';
  if (iVar12 - 1U < 4) {
    local_19c0 = (char *)recv((pNVar15->RS232Port).s,pcVar8,(long)(int)(0xfffU - iVar3),0);
    if (-1 < (int)local_19c0) {
      cVar13 = ((int)local_19c0 == 0) * '\x02';
    }
  }
  else if (iVar12 == 0) {
    local_19c0 = (char *)read(*(int *)&(local_19c8->RS232Port).hDev,pcVar8,(ulong)(0xfffU - iVar3));
    cVar13 = ((int)local_19c0 == 0) * '\x02';
    if ((int)local_19c0 < 0) {
      cVar13 = '\x01';
    }
  }
  pNVar15 = local_19c8;
  if (cVar13 == '\0') {
    if ((local_19c8->bSaveRawData != 0) && ((FILE *)local_19c8->pfSaveFile != (FILE *)0x0)) {
      fwrite(pcVar8,(long)(int)local_19c0,1,(FILE *)local_19c8->pfSaveFile);
      fflush((FILE *)pNVar15->pfSaveFile);
    }
    if (pNVar15->bEnableGPGGA != 0) {
      pcVar8 = strstr(recvbuf,"$GPGGA");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar5 = strchr(pcVar8 + 6,0xd);
        if (pcVar5 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        do {
          pcVar5 = pcVar8;
          pcVar8 = strstr(pcVar5 + 6,"$GPGGA");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar9 = strchr(pcVar8 + 6,0xd);
            if (pcVar9 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
          }
        } while (pcVar8 != (char *)0x0);
      }
    }
    if (pNVar15->bEnableGPRMC != 0) {
      pcVar8 = strstr(recvbuf,"$GPRMC");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar6 = strchr(pcVar8 + 6,0xd);
        if (pcVar6 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        do {
          pcVar6 = pcVar8;
          pcVar8 = strstr(pcVar6 + 6,"$GPRMC");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar9 = strchr(pcVar8 + 6,0xd);
            if (pcVar9 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
          }
        } while (pcVar8 != (char *)0x0);
      }
    }
    if (pNVar15->bEnableGPGLL != 0) {
      pcVar8 = strstr(recvbuf,"$GPGLL");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar4 = strchr(pcVar8 + 6,0xd);
        if (pcVar4 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        do {
          pcVar4 = pcVar8;
          pcVar8 = strstr(pcVar4 + 6,"$GPGLL");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar9 = strchr(pcVar8 + 6,0xd);
            if (pcVar9 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
          }
        } while (pcVar8 != (char *)0x0);
      }
    }
    if (pNVar15->bEnableGPVTG != 0) {
      pcVar8 = strstr(recvbuf,"$GPVTG");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar8 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        local_1930 = (char *)0x0;
      }
      else {
        do {
          local_1930 = pcVar8;
          pcVar8 = strstr(pcVar8 + 6,"$GPVTG");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar9 = strchr(pcVar8 + 6,0xd);
            if (pcVar9 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
          }
        } while (pcVar8 != (char *)0x0);
      }
    }
    if (pNVar15->bEnableHCHDG != 0) {
      pcVar8 = strstr(recvbuf,"$HCHDG");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar8 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        local_1948 = (char *)0x0;
      }
      else {
        do {
          local_1948 = pcVar8;
          pcVar8 = strstr(pcVar8 + 6,"$HCHDG");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar9 = strchr(pcVar8 + 6,0xd);
            if (pcVar9 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
          }
        } while (pcVar8 != (char *)0x0);
      }
    }
    if (pNVar15->bEnableIIMWV != 0) {
      pcVar8 = strstr(recvbuf,"$IIMWV");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar8 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        local_1950 = (char *)0x0;
      }
      else {
        do {
          local_1950 = pcVar8;
          pcVar8 = strstr(pcVar8 + 6,"$IIMWV");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar9 = strchr(pcVar8 + 6,0xd);
            if (pcVar9 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
          }
        } while (pcVar8 != (char *)0x0);
      }
    }
    if (pNVar15->bEnableWIMWV != 0) {
      pcVar8 = strstr(recvbuf,"$WIMWV");
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar9 = strchr(pcVar8 + 6,0xd);
        if (pcVar9 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        local_1958 = (char *)0x0;
      }
      else {
        do {
          local_1958 = pcVar8;
          pcVar8 = strstr(pcVar8 + 6,"$WIMWV");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            pcVar9 = strchr(pcVar8 + 6,0xd);
            if (pcVar9 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
          }
        } while (pcVar8 != (char *)0x0);
      }
    }
    local_1978 = pcVar4;
    if (pNVar15->bEnableWIMWD != 0) {
      pcVar4 = strstr(recvbuf,"$WIMWD");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar8 = strchr(pcVar4 + 6,0xd);
        if (pcVar8 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
      if (pcVar4 == (char *)0x0) {
        local_1960 = (char *)0x0;
      }
      else {
        do {
          local_1960 = pcVar4;
          pcVar4 = strstr(pcVar4 + 6,"$WIMWD");
          if (pcVar4 == (char *)0x0) {
            pcVar4 = (char *)0x0;
          }
          else {
            pcVar8 = strchr(pcVar4 + 6,0xd);
            if (pcVar8 == (char *)0x0) {
              pcVar4 = (char *)0x0;
            }
          }
        } while (pcVar4 != (char *)0x0);
      }
    }
    if (pNVar15->bEnableWIMDA != 0) {
      pcVar4 = strstr(recvbuf,"$WIMDA");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar8 = strchr(pcVar4 + 6,0xd);
        if (pcVar8 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
      if (pcVar4 == (char *)0x0) {
        local_1968 = (char *)0x0;
      }
      else {
        do {
          local_1968 = pcVar4;
          pcVar4 = strstr(pcVar4 + 6,"$WIMDA");
          if (pcVar4 == (char *)0x0) {
            pcVar4 = (char *)0x0;
          }
          else {
            pcVar8 = strchr(pcVar4 + 6,0xd);
            if (pcVar8 == (char *)0x0) {
              pcVar4 = (char *)0x0;
            }
          }
        } while (pcVar4 != (char *)0x0);
      }
    }
    iVar3 = (int)local_19b8 + (int)local_19c0;
    if (pNVar15->bEnableAIVDM != 0) {
      pcVar4 = strstr(recvbuf,"!AIVDM");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar7 = strchr(pcVar4 + 6,0xd);
        if (pcVar7 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
      }
      pcVar7 = (char *)0x0;
      while (pcVar8 = pcVar4, pcVar8 != (char *)0x0) {
        pcVar4 = strstr(pcVar8 + 6,"!AIVDM");
        pcVar7 = pcVar8;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
        else {
          pcVar8 = strchr(pcVar4 + 6,0xd);
          if (pcVar8 == (char *)0x0) {
            pcVar4 = (char *)0x0;
          }
        }
      }
    }
    goto LAB_00163f80;
  }
LAB_0016372a:
  pcVar4 = "Error reading data from a NMEADevice. ";
LAB_00163731:
  puts(pcVar4);
  return 1;
  while( true ) {
    iVar12 = __isoc99_sscanf(aisbuf + lVar14,",%d",&pNMEAData->nbfillbits);
    if (iVar12 == 1) {
      memset(aisbuf + lVar14,0,0x80 - lVar14);
      iVar3 = (int)lVar14;
      break;
    }
    lVar14 = lVar14 + 1;
    if (lVar14 == 0x7f) break;
LAB_001655ff:
    if (aisbuf[lVar14] == '\0') break;
  }
  if (iVar3 != 0) {
    decode_AIS(aisbuf,iVar3,&pNMEAData->AIS_Latitude,&pNMEAData->AIS_Longitude,&pNMEAData->AIS_SOG,
               &pNMEAData->AIS_COG);
  }
LAB_0016567d:
  memcpy(&local_19c8->LastNMEAData,pNMEAData,0x3d8);
  return 0;
}

Assistant:

inline int GetLatestDataNMEADevice(NMEADEVICE* pNMEADevice, NMEADATA* pNMEAData)
{
	char recvbuf[2*MAX_NB_BYTES_NMEADEVICE];
	char savebuf[MAX_NB_BYTES_NMEADEVICE];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_GPGGA = NULL;
	char* ptr_GPRMC = NULL;
	char* ptr_GPGLL = NULL;
	char* ptr_GPVTG = NULL;
	char* ptr_HCHDG = NULL;
	char* ptr_IIMWV = NULL;
	char* ptr_WIMWV = NULL;
	char* ptr_WIMWD = NULL;
	char* ptr_WIMDA = NULL;
	char* ptr_AIVDM = NULL;
	// Temporary buffers for sscanf().
	char c0 = 0, c1 = 0, c2 = 0;
	double f0 = 0, f1 = 0, f2 = 0;
	char aisbuf[128];
	int aisbuflen = 0;
	int i = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_NMEADEVICE-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a NMEADevice. \n");
		return EXIT_FAILURE;
	}
	if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
		fflush(pNMEADevice->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
			{
				printf("Error reading data from a NMEADevice : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a NMEADevice. \n");
				return EXIT_FAILURE;
			}
			if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
				fflush(pNMEADevice->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
	if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
	if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
	if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
	if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
	if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
	if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
	if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);

	while (
		(pNMEADevice->bEnableGPGGA&&!ptr_GPGGA)||
		(pNMEADevice->bEnableGPRMC&&!ptr_GPRMC)||
		(pNMEADevice->bEnableGPGLL&&!ptr_GPGLL)||
		(pNMEADevice->bEnableGPVTG&&!ptr_GPVTG)||
		(pNMEADevice->bEnableHCHDG&&!ptr_HCHDG)||
		(pNMEADevice->bEnableIIMWV&&!ptr_IIMWV)||
		(pNMEADevice->bEnableWIMWV&&!ptr_WIMWV)||
		(pNMEADevice->bEnableWIMWD&&!ptr_WIMWD)||
		(pNMEADevice->bEnableWIMDA&&!ptr_WIMDA)||
		(pNMEADevice->bEnableAIVDM&&!ptr_AIVDM)
		)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
		{
			printf("Error reading data from a NMEADevice : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_NMEADEVICE-1)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_NMEADEVICE-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a NMEADevice. \n");
			return EXIT_FAILURE;
		}
		if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pNMEADevice->pfSaveFile);
			fflush(pNMEADevice->pfSaveFile);
		}
		BytesReceived += Bytes;
		if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
		if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
		if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
		if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
		if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
		if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
		if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
		if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);
	}

	// Analyze data.

	memset(pNMEAData, 0, sizeof(NMEADATA));

	// GPS essential fix data.
	if (pNMEADevice->bEnableGPGGA)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude, &pNMEAData->height_geoid) != 15)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude) != 14)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator) != 11)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,,,,,%d", &pNMEAData->utc, &pNMEAData->GPS_quality_indicator) != 2)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,,,,,,%d", &pNMEAData->GPS_quality_indicator) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}
	}

	// GPS recommended minimum data.
	if (pNMEADevice->bEnableGPRMC)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date, &pNMEAData->variation, &pNMEAData->var_east) != 16)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date) != 14)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east) != 11)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,,%c", &pNMEAData->status) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;

		if (pNMEAData->date > 0)
		{
			pNMEAData->day = (int)pNMEAData->date/10000;
			pNMEAData->month = (int)pNMEAData->date/100-pNMEAData->day*100;
			pNMEAData->year = 2000+((int)pNMEAData->date-pNMEAData->day*10000)-pNMEAData->month*100;
		}
	}

	// GPS position, latitude / longitude and time.
	if (pNMEADevice->bEnableGPGLL)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if ((sscanf(ptr_GPGLL, "$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c", 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east, 
			&pNMEAData->utc, &pNMEAData->status) != 11)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,,%c", &pNMEAData->status) != 1))
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}
	}

	// GPS COG and SOG.
	if (pNMEADevice->bEnableGPVTG)
	{
		if ((sscanf(ptr_GPVTG, "$GPVTG,%lf,T,%lf,M,%lf,N", &pNMEAData->cog, &pNMEAData->mag_cog, &pNMEAData->sog) != 3)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,M,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,nan,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,NAN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,NaN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,,,%lf,N", &pNMEAData->sog) != 1))
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;
	}

	// Heading data.
	if (pNMEADevice->bEnableHCHDG)
	{
		if (sscanf(ptr_HCHDG, "$HCHDG,%lf,%lf,%c,%lf,%c", 
			&pNMEAData->heading, &pNMEAData->deviation, &pNMEAData->dev_east, &pNMEAData->variation, &pNMEAData->var_east) != 5)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert heading to angle in rad.
		pNMEAData->Heading = pNMEAData->heading*M_PI/180.0;
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableIIMWV)
	{
		if (sscanf(ptr_IIMWV, "$IIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableWIMWV)
	{
		if (sscanf(ptr_WIMWV, "$WIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind direction and speed, with respect to north.
	if (pNMEADevice->bEnableWIMWD)
	{
		if (sscanf(ptr_WIMWD, "$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 8)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// Meteorological composite data.
	if (pNMEADevice->bEnableWIMDA)
	{
		if (sscanf(ptr_WIMDA, "$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&f0, &c0, &pNMEAData->pressure, &pNMEAData->cpressure, &pNMEAData->temperature, &pNMEAData->ctemperature,  
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 14)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// AIS data.
	if (pNMEADevice->bEnableAIVDM)
	{
		memset(aisbuf, 0, sizeof(aisbuf));
		if (sscanf(ptr_AIVDM, "!AIVDM,%d,%d,,%c,%127s", 
			&pNMEAData->nbsentences, &pNMEAData->sentence_number, &pNMEAData->AIS_channel, aisbuf) != 4)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Only the most simple AIS messages are handled...
		if ((pNMEAData->nbsentences == 1)&&(pNMEAData->sentence_number == 1))
		{
			i = 0;
			// Search for the end of the AIS data payload.
			while ((i < (int)sizeof(aisbuf)-1)&&(aisbuf[i] != 0))
			{
				if (sscanf(aisbuf+i, ",%d", &pNMEAData->nbfillbits) == 1) 
				{
					aisbuflen = i;
					// Fill with 0 the rest of the buffer to keep only the AIS data payload in aisbuf.
					memset(aisbuf+i, 0, sizeof(aisbuf)-i);
					break;
				}
				i++;
			}
			if (aisbuflen != 0)
			{
				// Temporary...
#if defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
				decode_AIS(aisbuf, aisbuflen, &pNMEAData->AIS_Latitude, &pNMEAData->AIS_Longitude, &pNMEAData->AIS_SOG, &pNMEAData->AIS_COG);
#endif // defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
			}
			else
			{
				//printf("Error reading data from a NMEADevice : Invalid data. \n");
				//return EXIT_FAILURE;
			}
		}
		else
		{
			// Unhandled...
		}
	}

	pNMEADevice->LastNMEAData = *pNMEAData;

	return EXIT_SUCCESS;
}